

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

uint32_t msr_get_supported_cpu_model(void)

{
  int iVar1;
  ulong in_RAX;
  uint32_t cpu_model;
  uint32_t cpu_family;
  undefined8 local_18;
  
  local_18 = in_RAX;
  cpuid_get_family_model((uint32_t *)((long)&local_18 + 4),(uint32_t *)&local_18);
  iVar1 = cpuid_is_vendor_intel();
  if (iVar1 != 0) {
    iVar1 = cpuid_is_cpu_supported(local_18._4_4_,(uint32_t)local_18);
    if (iVar1 != 0) {
      return (uint32_t)local_18;
    }
  }
  fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
  fprintf(_stderr,"CPU not supported: Family=%u, Model=%02X\n",local_18 >> 0x20,
          local_18 & 0xffffffff);
  return 0;
}

Assistant:

uint32_t msr_get_supported_cpu_model(void) {
  uint32_t cpu_family;
  uint32_t cpu_model;
  cpuid_get_family_model(&cpu_family, &cpu_model);
  if (!cpuid_is_vendor_intel() || !cpuid_is_cpu_supported(cpu_family, cpu_model)) {
    raplcap_log(ERROR, "CPU not supported: Family=%"PRIu32", Model=%02X\n", cpu_family, cpu_model);
    return 0;
  }
  return cpu_model;
}